

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_connectionErrorNoMapVariablesType_Test::TestBody
          (Parser_connectionErrorNoMapVariablesType_Test *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_1404;
  allocator_type local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  allocator<char> local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  string local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  string in;
  ParserPtr p;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component1\">\n    <variable name=\"variable1\" units=\"scrat\"/>\n  </component>\n  <component name=\"component2\">\n    <variable name=\"variable2\" units=\"phils\"/>\n  </component>\n  <connection component_1=\"component1\"  component_2=\"component2\">\n    <map_variabels variable_1=\"variable1\" variable_2=\"variable2\"/>\n  </connection>\n</model>\n"
             ,(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"Connection in model \'\' has an invalid child element \'map_variabels\'."
             ,local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Connection in model \'\' does not have a map_variables element.",
             (allocator<char> *)&gtest_trace_1404);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "Model does not contain the units \'scrat\' required by variable \'variable1\' in component \'component1\'."
             ,&local_f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "Model does not contain the units \'phils\' required by variable \'variable2\' in component \'component2\'."
             ,&local_f2);
  __l._M_len = 4;
  __l._M_array = (iterator)&p;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_f3);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Parser::create(SUB81(&p,0));
  libcellml::Parser::parseModel(local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_1404,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/parser.cpp"
             ,0x57c,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Parser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_f0,
             &p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_1404);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

TEST(Parser, connectionErrorNoMapVariablesType)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1\" units=\"scrat\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\" units=\"phils\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\"  component_2=\"component2\">\n"
        "    <map_variabels variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model '' has an invalid child element 'map_variabels'.",
        "Connection in model '' does not have a map_variables element.",
        "Model does not contain the units 'scrat' required by variable 'variable1' in component 'component1'.",
        "Model does not contain the units 'phils' required by variable 'variable2' in component 'component2'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}